

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.h
# Opt level: O0

CornerIndex __thiscall draco::CornerTable::GetLeftCorner(CornerTable *this,CornerIndex corner_id)

{
  bool bVar1;
  uint in_ESI;
  CornerIndex in_EDI;
  CornerTable *in_stack_ffffffffffffffd8;
  CornerIndex corner;
  undefined4 in_stack_ffffffffffffffec;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_8;
  uint local_4;
  
  local_8.value_ = in_ESI;
  corner.value_ = in_EDI.value_;
  bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                    (&local_8,(IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                              &kInvalidCornerIndex);
  if (bVar1) {
    local_4 = 0xffffffff;
  }
  else {
    Previous((CornerTable *)CONCAT44(in_stack_ffffffffffffffec,local_8.value_),in_EDI);
    local_4 = (uint)Opposite(in_stack_ffffffffffffffd8,corner);
  }
  return (CornerIndex)local_4;
}

Assistant:

inline CornerIndex GetLeftCorner(CornerIndex corner_id) const {
    if (corner_id == kInvalidCornerIndex) {
      return kInvalidCornerIndex;
    }
    return Opposite(Previous(corner_id));
  }